

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::ColoredWriteToStderr(LogSeverity severity,char *message,size_t len)

{
  char *pcVar1;
  size_t sStack_30;
  
  sStack_30 = len;
  if ((LogDestination::terminal_supports_color_ == '\x01') &&
     (fLB::FLAGS_colorlogtostderr == '\x01')) {
    if (3 < (uint)severity) {
      __assert_fail("severity >= 0 && severity < NUM_SEVERITIES",
                    "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                    ,0x127,"GLogColor google::SeverityToColor(LogSeverity)");
    }
    if (severity - 2U < 2) {
      pcVar1 = "1";
    }
    else {
      if (severity == 0) goto LAB_00116560;
      pcVar1 = "3";
    }
    fprintf(_stderr,"\x1b[0;3%sm",pcVar1);
    fwrite(message,len,1,_stderr);
    message = "\x1b[m";
    sStack_30 = 3;
  }
LAB_00116560:
  fwrite(message,sStack_30,1,_stderr);
  return;
}

Assistant:

static void ColoredWriteToStderr(LogSeverity severity,
                                 const char* message, size_t len) {
  const GLogColor color =
      (LogDestination::terminal_supports_color() && FLAGS_colorlogtostderr) ?
      SeverityToColor(severity) : COLOR_DEFAULT;

  // Avoid using cerr from this module since we may get called during
  // exit code, and cerr may be partially or fully destroyed by then.
  if (COLOR_DEFAULT == color) {
    fwrite(message, len, 1, stderr);
    return;
  }
#ifdef GLOG_OS_WINDOWS
  const HANDLE stderr_handle = GetStdHandle(STD_ERROR_HANDLE);

  // Gets the current text color.
  CONSOLE_SCREEN_BUFFER_INFO buffer_info;
  GetConsoleScreenBufferInfo(stderr_handle, &buffer_info);
  const WORD old_color_attrs = buffer_info.wAttributes;

  // We need to flush the stream buffers into the console before each
  // SetConsoleTextAttribute call lest it affect the text that is already
  // printed but has not yet reached the console.
  fflush(stderr);
  SetConsoleTextAttribute(stderr_handle,
                          GetColorAttribute(color) | FOREGROUND_INTENSITY);
  fwrite(message, len, 1, stderr);
  fflush(stderr);
  // Restores the text color.
  SetConsoleTextAttribute(stderr_handle, old_color_attrs);
#else
  fprintf(stderr, "\033[0;3%sm", GetAnsiColorCode(color));
  fwrite(message, len, 1, stderr);
  fprintf(stderr, "\033[m");  // Resets the terminal to default.
#endif  // GLOG_OS_WINDOWS
}